

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVirtualProtocol.h
# Opt level: O1

uint32_t __thiscall
duckdb_apache::thrift::protocol::
TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb_apache::thrift::transport::TTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
::readBool_virt(TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb_apache::thrift::transport::TTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
                *this,bool *value)

{
  _func_int **pp_Var1;
  bool bVar2;
  uint8_t b [1];
  char local_19;
  
  bVar2 = (char)this[1].super_TProtocolDefaults.super_TProtocol.input_recursion_depth_ != '\x01';
  if (bVar2) {
    pp_Var1 = this[1].super_TProtocolDefaults.super_TProtocol._vptr_TProtocol;
    (**(code **)(*pp_Var1 + 0x38))(pp_Var1,&local_19,1);
    *value = local_19 == '\x01';
  }
  else {
    *value = *(bool *)((long)&this[1].super_TProtocolDefaults.super_TProtocol.input_recursion_depth_
                      + 1);
    *(undefined1 *)&this[1].super_TProtocolDefaults.super_TProtocol.input_recursion_depth_ = 0;
  }
  return (uint)bVar2;
}

Assistant:

uint32_t readBool_virt(bool& value) override {
    return static_cast<Protocol_*>(this)->readBool(value);
  }